

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  string *psVar5;
  char *pcVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  bool local_6d9;
  bool local_6ba;
  bool local_649;
  undefined1 local_648 [7];
  bool has_newline;
  string line;
  string local_620 [3];
  char hex [4];
  char c;
  string output;
  long offset;
  long sizeLimit;
  string local_5e8 [39];
  allocator local_5c1;
  undefined1 local_5c0 [8];
  string error;
  ifstream file;
  undefined1 local_398 [8];
  string variable;
  string local_358 [8];
  string fileName;
  cmCAEnabler hexOutputArg;
  cmCAString limitArg;
  cmCAString offsetArg;
  cmCAString resultArg;
  cmCAString fileNameArg;
  cmCAString readArg;
  cmCommandArgumentGroup group;
  cmCommandArgumentsHelper argHelper;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"READ must be called with at least two additional arguments",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    cmCommandArgumentsHelper::cmCommandArgumentsHelper
              ((cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCommandArgumentGroup::cmCommandArgumentGroup((cmCommandArgumentGroup *)&readArg.DataStart);
    cmCAString::cmCAString
              ((cmCAString *)&fileNameArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"READ",
               (cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString
              ((cmCAString *)&resultArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(char *)0x0,
               (cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString
              ((cmCAString *)&offsetArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(char *)0x0,
               (cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString
              ((cmCAString *)&limitArg.DataStart,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"OFFSET",
               (cmCommandArgumentGroup *)&readArg.DataStart);
    cmCAString::cmCAString
              ((cmCAString *)&hexOutputArg.Enabled,
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"LIMIT",
               (cmCommandArgumentGroup *)&readArg.DataStart);
    cmCAEnabler::cmCAEnabler
              ((cmCAEnabler *)((long)&fileName.field_2 + 8),
               (cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"HEX",
               (cmCommandArgumentGroup *)&readArg.DataStart);
    cmCommandArgument::Follows((cmCommandArgument *)&fileNameArg.DataStart,(cmCommandArgument *)0x0)
    ;
    cmCommandArgument::Follows
              ((cmCommandArgument *)&resultArg.DataStart,(cmCommandArgument *)&fileNameArg.DataStart
              );
    cmCommandArgument::Follows
              ((cmCommandArgument *)&offsetArg.DataStart,(cmCommandArgument *)&resultArg.DataStart);
    cmCommandArgumentGroup::Follows
              ((cmCommandArgumentGroup *)&readArg.DataStart,
               (cmCommandArgument *)&offsetArg.DataStart);
    cmCommandArgumentsHelper::Parse
              ((cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_20,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    psVar5 = cmCAString::GetString_abi_cxx11_((cmCAString *)&resultArg.DataStart);
    std::__cxx11::string::string(local_358,(string *)psVar5);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar6);
    if (!bVar1) {
      pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator=(local_358,pcVar6);
      psVar5 = cmCAString::GetString_abi_cxx11_((cmCAString *)&resultArg.DataStart);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&variable.field_2 + 8),"/",psVar5);
      std::__cxx11::string::operator+=(local_358,(string *)(variable.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(variable.field_2._M_local_buf + 8));
    }
    psVar5 = cmCAString::GetString_abi_cxx11_((cmCAString *)&offsetArg.DataStart);
    std::__cxx11::string::string((string *)local_398,(string *)psVar5);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&error.field_2 + 8),pcVar6,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&error.field_2 +
                                       *(long *)(error.field_2._8_8_ + -0x18) + 8));
    if ((bVar2 & 1) == 0) {
      offset = -1;
      cmCAString::GetString_abi_cxx11_((cmCAString *)&hexOutputArg.Enabled);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar6 = cmCAString::GetCString((cmCAString *)&hexOutputArg.Enabled);
        iVar3 = atoi(pcVar6);
        offset = (long)iVar3;
      }
      output.field_2._8_4_ = 0;
      cmCAString::GetString_abi_cxx11_((cmCAString *)&limitArg.DataStart);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar6 = cmCAString::GetCString((cmCAString *)&limitArg.DataStart);
        output.field_2._8_4_ = atoi(pcVar6);
      }
      std::istream::seekg((long)((long)&error.field_2 + 8),output.field_2._8_4_);
      std::__cxx11::string::string(local_620);
      bVar1 = cmCAEnabler::IsEnabled((cmCAEnabler *)((long)&fileName.field_2 + 8));
      if (bVar1) {
        while( true ) {
          local_6ba = false;
          if (offset != 0) {
            plVar8 = (long *)std::istream::get(error.field_2._M_local_buf + 8);
            local_6ba = std::ios::operator_cast_to_bool
                                  ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
          }
          if (local_6ba == false) break;
          sprintf(line.field_2._M_local_buf + 0xb,"%.2x",(ulong)(byte)line.field_2._M_local_buf[0xf]
                 );
          std::__cxx11::string::operator+=(local_620,line.field_2._M_local_buf + 0xb);
          if (0 < offset) {
            offset = offset + -1;
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)local_648);
        local_649 = false;
        while( true ) {
          local_6d9 = false;
          if (offset != 0) {
            local_6d9 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)(error.field_2._M_local_buf + 8),(string *)local_648,
                                   &local_649,offset);
          }
          if (local_6d9 == false) break;
          if (0 < offset) {
            lVar9 = std::__cxx11::string::size();
            offset = offset - lVar9;
            if ((local_649 & 1U) != 0) {
              offset = offset + -1;
            }
            if (offset < 0) {
              offset = 0;
            }
          }
          std::__cxx11::string::operator+=(local_620,(string *)local_648);
          if ((local_649 & 1U) != 0) {
            std::__cxx11::string::operator+=(local_620,"\n");
          }
        }
        std::__cxx11::string::~string((string *)local_648);
      }
      this_00 = (this->super_cmCommand).Makefile;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,(string *)local_398,pcVar6);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string(local_620);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_5c0,"failed to open for reading (",&local_5c1);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::operator+=((string *)local_5c0,local_5e8);
      std::__cxx11::string::~string(local_5e8);
      std::__cxx11::string::operator+=((string *)local_5c0,"):\n  ");
      std::__cxx11::string::operator+=((string *)local_5c0,local_358);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_5c0);
    }
    std::ifstream::~ifstream((void *)((long)&error.field_2 + 8));
    std::__cxx11::string::~string((string *)local_398);
    std::__cxx11::string::~string(local_358);
    cmCAEnabler::~cmCAEnabler((cmCAEnabler *)((long)&fileName.field_2 + 8));
    cmCAString::~cmCAString((cmCAString *)&hexOutputArg.Enabled);
    cmCAString::~cmCAString((cmCAString *)&limitArg.DataStart);
    cmCAString::~cmCAString((cmCAString *)&offsetArg.DataStart);
    cmCAString::~cmCAString((cmCAString *)&resultArg.DataStart);
    cmCAString::~cmCAString((cmCAString *)&fileNameArg.DataStart);
    cmCommandArgumentGroup::~cmCommandArgumentGroup((cmCommandArgumentGroup *)&readArg.DataStart);
    cmCommandArgumentsHelper::~cmCommandArgumentsHelper
              ((cmCommandArgumentsHelper *)
               &group.ContainedArguments.
                super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if ( args.size() < 3 )
    {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
    }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg    (&argHelper, "READ");
  cmCAString fileNameArg    (&argHelper, 0);
  cmCAString resultArg      (&argHelper, 0);

  cmCAString offsetArg      (&argHelper, "OFFSET", &group);
  cmCAString limitArg       (&argHelper, "LIMIT", &group);
  cmCAEnabler hexOutputArg  (&argHelper, "HEX", &group);
  readArg.Follows(0);
  fileNameArg.Follows(&readArg);
  resultArg.Follows(&fileNameArg);
  group.Follows(&resultArg);
  argHelper.Parse(&args, 0);

  std::string fileName = fileNameArg.GetString();
  if ( !cmsys::SystemTools::FileIsFullPath(fileName.c_str()) )
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg.GetString();
    }

  std::string variable = resultArg.GetString();

  // Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(), std::ios::in |
               (hexOutputArg.IsEnabled() ? std::ios::binary : std::ios::in));
#else
  cmsys::ifstream file(fileName.c_str(), std::ios::in);
#endif

  if ( !file )
    {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
    }

  // is there a limit?
  long sizeLimit = -1;
  if (!limitArg.GetString().empty())
    {
    sizeLimit = atoi(limitArg.GetCString());
    }

  // is there an offset?
  long offset = 0;
  if (!offsetArg.GetString().empty())
    {
    offset = atoi(offsetArg.GetCString());
    }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (hexOutputArg.IsEnabled())
    {
    // Convert part of the file into hex code
    char c;
    while((sizeLimit != 0) && (file.get(c)))
      {
      char hex[4];
      sprintf(hex, "%.2x", c&0xff);
      output += hex;
      if (sizeLimit > 0)
        {
        sizeLimit--;
        }
      }
    }
  else
    {
    std::string line;
    bool has_newline = false;
    while (sizeLimit != 0 &&
          cmSystemTools::GetLineFromStream(file, line, &has_newline,
                                            sizeLimit) )
      {
      if (sizeLimit > 0)
        {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline)
          {
          sizeLimit--;
          }
        if (sizeLimit < 0)
          {
          sizeLimit = 0;
          }
        }
      output += line;
      if ( has_newline )
        {
        output += "\n";
        }
      }
    }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}